

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool anon_unknown.dwarf_59ef72::extract_tar(char *outFileName,bool verbose,bool extract)

{
  FILE *__stream;
  archive_entry *entry_00;
  wchar_t wVar1;
  uint uVar2;
  mode_t mVar3;
  int iVar4;
  archive *a;
  archive *_a;
  char *pcVar5;
  Encoding *pEVar6;
  wstring *__s;
  la_int64_t lVar7;
  ulong uVar8;
  size_t sVar9;
  dev_t dVar10;
  dev_t dVar11;
  size_t sVar12;
  tm *__tp;
  la_ssize_t r;
  long *plVar13;
  size_type *psVar14;
  char *cstr;
  wchar_t *wcstr;
  wchar_t *wcstr_00;
  wchar_t *wcstr_01;
  wchar_t *wcstr_02;
  undefined7 in_register_00000031;
  char *__format;
  bool bVar15;
  archive_entry *entry;
  char tmp [100];
  time_t tim;
  size_t size;
  cmLocaleRAII localeRAII;
  archive_entry *local_f0;
  wstring local_e8 [3];
  time_t local_80;
  undefined4 local_74;
  string local_70;
  cmLocaleRAII local_50;
  
  local_74 = (undefined4)CONCAT71(in_register_00000031,verbose);
  cmLocaleRAII::cmLocaleRAII(&local_50);
  a = archive_read_new();
  _a = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  cmsys::Encoding::ToWide_abi_cxx11_(local_e8,(Encoding *)outFileName,cstr);
  wVar1 = archive_read_open_filename_w(a,local_e8[0]._M_dataplus._M_p,0x2800);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e8[0]._M_dataplus._M_p != &local_e8[0].field_2) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity * 4 + 4);
  }
  if (wVar1 == L'\0') {
LAB_001ff47a:
    do {
      wVar1 = archive_read_next_header(a,&local_f0);
      entry_00 = local_f0;
      __stream = _stdout;
      if (wVar1 != L'\0') {
        if (wVar1 != L'\x01') {
          pcVar5 = archive_error_string(a);
          cmSystemTools::Error
                    ("Problem with archive_read_next_header(): ",pcVar5,(char *)0x0,(char *)0x0);
        }
        goto LAB_001ff4b5;
      }
      if ((char)local_74 == '\0') {
        if (!extract) {
          pEVar6 = (Encoding *)archive_entry_pathname_w(local_f0);
          cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_e8,pEVar6,wcstr_00);
          cmSystemTools::Stdout((string *)local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_e8[0]._M_dataplus._M_p != &local_e8[0].field_2) {
            operator_delete(local_e8[0]._M_dataplus._M_p,
                            local_e8[0].field_2._M_allocated_capacity + 1);
          }
          local_e8[0]._M_dataplus._M_p = (pointer)&local_e8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"\n","");
          cmSystemTools::Stdout((string *)local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_e8[0]._M_dataplus._M_p != &local_e8[0].field_2) {
            operator_delete(local_e8[0]._M_dataplus._M_p,
                            local_e8[0].field_2._M_allocated_capacity + 1);
          }
          goto LAB_001ff47a;
        }
      }
      else {
        if (extract) {
          local_e8[0]._M_dataplus._M_p = (pointer)&local_e8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"x ","");
          cmSystemTools::Stdout((string *)local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_e8[0]._M_dataplus._M_p != &local_e8[0].field_2) {
            operator_delete(local_e8[0]._M_dataplus._M_p,
                            local_e8[0].field_2._M_allocated_capacity + 1);
          }
          pEVar6 = (Encoding *)archive_entry_pathname_w(local_f0);
          cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_e8,pEVar6,wcstr);
          cmSystemTools::Stdout((string *)local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_e8[0]._M_dataplus._M_p != &local_e8[0].field_2) {
            operator_delete(local_e8[0]._M_dataplus._M_p,
                            local_e8[0].field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now == 0) {
            time(&(anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now);
          }
          pcVar5 = archive_entry_strmode((archive_entry_conflict *)entry_00);
          uVar2 = archive_entry_nlink(entry_00);
          fprintf(__stream,"%s %d ",pcVar5,(ulong)uVar2);
          __s = (wstring *)archive_entry_uname(entry_00);
          if ((__s == (wstring *)0x0) || (*(char *)&(__s->_M_dataplus)._M_p == '\0')) {
            lVar7 = archive_entry_uid(entry_00);
            sprintf((char *)local_e8,"%lu ",lVar7);
            __s = local_e8;
          }
          uVar8 = strlen((char *)__s);
          if (uVar8 < 7) {
            uVar8 = 6;
          }
          fprintf(__stream,"%-*s ",uVar8 & 0xffffffff,__s);
          pcVar5 = archive_entry_gname(entry_00);
          if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
            lVar7 = archive_entry_gid(entry_00);
            sprintf((char *)local_e8,"%lu",lVar7);
            sVar9 = strlen((char *)local_e8);
            fputs((char *)local_e8,__stream);
          }
          else {
            fputs(pcVar5,__stream);
            sVar9 = strlen(pcVar5);
          }
          mVar3 = archive_entry_filetype(entry_00);
          if ((mVar3 == 0x2000) || (mVar3 = archive_entry_filetype(entry_00), mVar3 == 0x6000)) {
            dVar10 = archive_entry_rdevmajor(entry_00);
            dVar11 = archive_entry_rdevminor(entry_00);
            sprintf((char *)local_e8,"%lu,%lu",dVar10,dVar11);
          }
          else {
            lVar7 = archive_entry_size(entry_00);
            sprintf((char *)local_e8,"%lu",lVar7);
          }
          sVar12 = strlen((char *)local_e8);
          iVar4 = (int)(sVar12 + sVar9) + 1;
          if (sVar12 + sVar9 < 0xd) {
            iVar4 = 0xd;
          }
          fprintf(__stream,"%*s",(ulong)(uint)(iVar4 - (int)sVar9),local_e8);
          local_80 = archive_entry_mtime(entry_00);
          pcVar5 = "%e %b %H:%M";
          if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + 0xf099c0 <
              local_80) {
            pcVar5 = "%e %b  %Y";
          }
          if (local_80 <
              (anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + -0xf099c0) {
            pcVar5 = "%e %b  %Y";
          }
          __tp = localtime(&local_80);
          strftime((char *)local_e8,100,pcVar5,__tp);
          fprintf(__stream," %s ",local_e8);
          pEVar6 = (Encoding *)archive_entry_pathname_w(entry_00);
          cmsys::Encoding::ToNarrow_abi_cxx11_(&local_70,pEVar6,wcstr_01);
          fputs(local_70._M_dataplus._M_p,__stream);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          pcVar5 = archive_entry_hardlink(entry_00);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = archive_entry_symlink(entry_00);
            if (pcVar5 != (char *)0x0) {
              pcVar5 = archive_entry_symlink(entry_00);
              __format = " -> %s";
              goto LAB_001ff37c;
            }
          }
          else {
            pcVar5 = archive_entry_hardlink(entry_00);
            __format = " link to %s";
LAB_001ff37c:
            fprintf(__stream,__format,pcVar5);
          }
          fflush(__stream);
        }
        local_e8[0]._M_dataplus._M_p = (pointer)&local_e8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"\n","");
        cmSystemTools::Stdout((string *)local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_e8[0]._M_dataplus._M_p != &local_e8[0].field_2) {
          operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1
                         );
        }
        if (!extract) goto LAB_001ff47a;
      }
      wVar1 = archive_write_disk_set_options(_a,L'\x04');
      if (wVar1 != L'\0') {
        pcVar5 = archive_error_string(_a);
        cmSystemTools::Error
                  ("Problem with archive_write_disk_set_options(): ",pcVar5,(char *)0x0,(char *)0x0)
        ;
        goto LAB_001ff4b5;
      }
      wVar1 = archive_write_header(_a,local_f0);
      if (wVar1 != L'\0') {
        pcVar5 = archive_error_string(_a);
        cmSystemTools::Error("Problem with archive_write_header(): ",pcVar5,(char *)0x0,(char *)0x0)
        ;
        pEVar6 = (Encoding *)archive_entry_pathname_w(local_f0);
        cmsys::Encoding::ToNarrow_abi_cxx11_(&local_70,pEVar6,wcstr_02);
        plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x4dff63);
        psVar14 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)psVar14) {
          local_e8[0].field_2._0_8_ = *psVar14;
          local_e8[0].field_2._8_8_ = plVar13[3];
          local_e8[0]._M_dataplus._M_p = (pointer)&local_e8[0].field_2;
        }
        else {
          local_e8[0].field_2._0_8_ = *psVar14;
          local_e8[0]._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_e8[0]._M_string_length = plVar13[1];
        *plVar13 = (long)psVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        cmSystemTools::Error((string *)local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_e8[0]._M_dataplus._M_p != &local_e8[0].field_2) {
          operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001ff4b5;
      }
LAB_001ff40b:
      iVar4 = archive_read_data_block(a,(void **)local_e8,(size_t *)&local_70,&local_80);
      if (iVar4 != 1) {
        bVar15 = la_diagnostic(a,(long)iVar4);
        if (bVar15) goto code_r0x001ff43a;
        goto LAB_001ff4b3;
      }
      wVar1 = archive_write_finish_entry(_a);
      if (wVar1 != L'\0') goto LAB_001ff5f9;
    } while( true );
  }
  pcVar5 = archive_error_string(a);
  cmSystemTools::Error("Problem with archive_read_open_file(): ",pcVar5,(char *)0x0,(char *)0x0);
  archive_write_free(_a);
  archive_read_close(a);
  bVar15 = false;
LAB_001ff4d3:
  cmLocaleRAII::~cmLocaleRAII(&local_50);
  return bVar15;
code_r0x001ff43a:
  r = archive_write_data_block
                (_a,local_e8[0]._M_dataplus._M_p,(size_t)local_70._M_dataplus._M_p,local_80);
  bVar15 = la_diagnostic(a,r);
  if (!bVar15) {
LAB_001ff4b3:
    wVar1 = L'\0';
    goto LAB_001ff4b5;
  }
  goto LAB_001ff40b;
LAB_001ff5f9:
  pcVar5 = archive_error_string(_a);
  cmSystemTools::Error("Problem with archive_write_finish_entry(): ",pcVar5,(char *)0x0,(char *)0x0)
  ;
LAB_001ff4b5:
  archive_write_free(_a);
  archive_read_close(a);
  archive_read_free(a);
  bVar15 = (uint)wVar1 < 2;
  goto LAB_001ff4d3;
}

Assistant:

bool extract_tar(const char* outFileName, bool verbose, bool extract)
{
  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);
  struct archive* a = archive_read_new();
  struct archive* ext = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  struct archive_entry* entry;
  int r = cm_archive_read_open_file(a, outFileName, 10240);
  if (r) {
    cmSystemTools::Error("Problem with archive_read_open_file(): ",
                         archive_error_string(a));
    archive_write_free(ext);
    archive_read_close(a);
    return false;
  }
  for (;;) {
    r = archive_read_next_header(a, &entry);
    if (r == ARCHIVE_EOF) {
      break;
    }
    if (r != ARCHIVE_OK) {
      cmSystemTools::Error("Problem with archive_read_next_header(): ",
                           archive_error_string(a));
      break;
    }
    if (verbose) {
      if (extract) {
        cmSystemTools::Stdout("x ");
        cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      } else {
        list_item_verbose(stdout, entry);
      }
      cmSystemTools::Stdout("\n");
    } else if (!extract) {
      cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      cmSystemTools::Stdout("\n");
    }
    if (extract) {
      r = archive_write_disk_set_options(ext, ARCHIVE_EXTRACT_TIME);
      if (r != ARCHIVE_OK) {
        cmSystemTools::Error("Problem with archive_write_disk_set_options(): ",
                             archive_error_string(ext));
        break;
      }

      r = archive_write_header(ext, entry);
      if (r == ARCHIVE_OK) {
        if (!copy_data(a, ext)) {
          break;
        }
        r = archive_write_finish_entry(ext);
        if (r != ARCHIVE_OK) {
          cmSystemTools::Error("Problem with archive_write_finish_entry(): ",
                               archive_error_string(ext));
          break;
        }
      }
#  ifdef _WIN32
      else if (const char* linktext = archive_entry_symlink(entry)) {
        std::cerr << "cmake -E tar: warning: skipping symbolic link \""
                  << cm_archive_entry_pathname(entry) << "\" -> \"" << linktext
                  << "\"." << std::endl;
      }
#  endif
      else {
        cmSystemTools::Error("Problem with archive_write_header(): ",
                             archive_error_string(ext));
        cmSystemTools::Error("Current file: " +
                             cm_archive_entry_pathname(entry));
        break;
      }
    }
  }